

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_operators.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int argc_local;
  tst_qpromise_operators tc;
  QCoreApplication app;
  
  argc_local = argc;
  QCoreApplication::QCoreApplication(&app,&argc_local,argv,0x60204);
  QCoreApplication::setAttribute(AA_Use96Dpi,true);
  tst_qpromise_operators::tst_qpromise_operators(&tc);
  QTest::setMainSourcePath
            ("/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/build_O2/tests/auto/qtpromise/qpromise"
            );
  iVar1 = QTest::qExec(&tc.super_QObject,argc_local,argv);
  QObject::~QObject(&tc.super_QObject);
  QCoreApplication::~QCoreApplication(&app);
  return iVar1;
}

Assistant:

void tst_qpromise_operators::move()
{
    auto p0 = QtPromise::QPromise<int>::resolve(42);

    QCOMPARE(p0.isFulfilled(), true);
    QCOMPARE(waitForValue(p0, -1), 42);

    p0 = QtPromise::QPromise<int>{
        [](const QtPromise::QPromiseResolve<int>&, const QtPromise::QPromiseReject<int>& reject) {
            QtPromisePrivate::qtpromise_defer([=]() {
                reject(QString{"foo"});
            });
        }};

    QCOMPARE(p0.isPending(), true);
    QCOMPARE(waitForError(p0, QString{}), QString{"foo"});

    p0 = QtPromise::QPromise<int>{[](const QtPromise::QPromiseResolve<int>& resolve) {
        QtPromisePrivate::qtpromise_defer([=]() {
            resolve(43);
        });
    }};

    QCOMPARE(p0.isPending(), true);
    QCOMPARE(waitForValue(p0, -1), 43);
}